

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pulseShape.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ostream *poVar3;
  FILE *__stream;
  char *pcVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  long lVar10;
  unsigned_long uVar11;
  double dVar12;
  result_type rVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double local_298;
  double local_290;
  double local_280;
  vector<double,_std::allocator<double>_> S2tot;
  vector<double,_std::allocator<double>_> S1tot;
  vector<double,_std::allocator<double>_> means;
  vector<unsigned_long,_std::allocator<unsigned_long>_> num;
  vector<double,_std::allocator<double>_> tns;
  vector<double,_std::allocator<double>_> S2max;
  double a;
  vector<double,_std::allocator<double>_> S1f30;
  vector<double,_std::allocator<double>_> NonBlank;
  vector<double,_std::allocator<double>_> top;
  vector<double,_std::allocator<double>_> bot;
  double e;
  default_random_engine generator;
  vector<double,_std::allocator<double>_> T0X;
  vector<double,_std::allocator<double>_> CI_left;
  vector<unsigned_long,_std::allocator<unsigned_long>_> win;
  vector<double,_std::allocator<double>_> driftT;
  vector<double,_std::allocator<double>_> S2width;
  vector<double,_std::allocator<double>_> CI_right;
  double d;
  double c;
  double b;
  uniform_real_distribution<double> local_88;
  char line [60];
  
  if (verbosity < 2) {
    if (argc < 3) {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd max."
                              );
      std::endl<char,std::char_traits<char>>(poVar3);
      return 1;
    }
    local_280 = atof(argv[1]);
    dVar12 = atof(argv[2]);
  }
  else {
    local_280 = minS1;
    dVar12 = maxS1;
  }
  generator._M_x = 1;
  local_88._M_param._M_a = 0.0;
  local_88._M_param._M_b = 20.0;
  num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  top.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  top.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  top.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __stream = fopen("photon_times.txt","r");
  do {
    iVar1 = getc(__stream);
  } while (iVar1 != 10);
  while (pcVar4 = fgets(line,0x28,__stream), pcVar4 != (char *)0x0) {
    if (verbosity < 2) {
      __isoc99_sscanf(line,"%lf\t%lf\t%lf\t%lf\t%lf",&a,&b,&c,&d,&e);
    }
    else {
      __isoc99_sscanf(line,"%lf\t%lf",&a,&b);
    }
    iVar1 = feof(__stream);
    if (iVar1 != 0) goto LAB_0010172c;
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((long)(a - 9.223372036854776e+18) & (long)a >> 0x3f | (long)a);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
              (&num,(unsigned_long *)&means);
    std::vector<double,_std::allocator<double>_>::push_back(&tns,&b);
    if (verbosity < 2) {
      if (1000.0 < b) {
        e = 0.0;
      }
      std::vector<double,_std::allocator<double>_>::push_back(&bot,&c);
      std::vector<double,_std::allocator<double>_>::push_back(&top,&d);
      means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((long)(e - 9.223372036854776e+18) & (long)e >> 0x3f | (long)e);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (&win,(unsigned_long *)&means);
    }
  }
  uVar2 = (int)(long)a + 1;
  NUMEVT = (unsigned_long)uVar2;
  if (uVar2 % 10 != 0) {
    std::operator<<((ostream *)&std::cerr,
                    "Warning! Check to see if last event(s) missing b/c S1=0.\n");
  }
LAB_0010172c:
  fclose(__stream);
  if (verbosity < 2) {
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S1tot,NUMEVT,(value_type *)&means,(allocator_type *)&S2tot);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S2tot,NUMEVT,(value_type *)&means,(allocator_type *)&S2max);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S2max,NUMEVT,(value_type *)&means,(allocator_type *)&CI_left);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&CI_left,NUMEVT,(value_type *)&means,(allocator_type *)&CI_right);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&CI_right,NUMEVT,(value_type *)&means,(allocator_type *)&S2width);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S2width,NUMEVT,(value_type *)&means,(allocator_type *)&S1f30);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S1f30,NUMEVT,(value_type *)&means,(allocator_type *)&T0X);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&T0X,NUMEVT,(value_type *)&means,(allocator_type *)&driftT);
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&driftT,NUMEVT,(value_type *)&means,(allocator_type *)&NonBlank);
    lVar6 = (long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    for (lVar10 = 0; lVar6 != lVar10; lVar10 = lVar10 + 1) {
      uVar9 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = 1.79769313486232e+308;
      if (1000.0 < tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10] ||
          tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] == 1000.0) {
        S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             (top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10] +
             bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar10]) * 1.015 +
             S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
        dVar17 = top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10] +
                 bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
        if (S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] <= dVar17 &&
            dVar17 != S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]) {
          S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] = dVar17;
          driftT.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_start[uVar9] =
               tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] + -1000.0;
        }
      }
      else {
        S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             top.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar10] +
             bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar10] +
             S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
      }
    }
    dVar17 = 0.0;
    for (lVar10 = 0; lVar6 != lVar10; lVar10 = lVar10 + 1) {
      if (1000.0 <= tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10]) {
        uVar9 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        if ((S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] == 0.0) &&
           (!NAN(S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9]))) {
          dVar17 = (top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar10] +
                   bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar10]) * 1.015 + dVar17;
          dVar16 = S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          if (((dVar16 * 0.0225 < dVar17) &&
              (((CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9] == 0.0 &&
                (!NAN(CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9]))) &&
               (CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] == 0.0)))) &&
             (!NAN(CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]))) {
            CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] =
                 tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
            dVar16 = S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
          }
          if (((dVar16 * 0.5 < dVar17) &&
              (CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9] == 0.0)) &&
             ((!NAN(CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9]) &&
              ((CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar9] != 0.0 ||
               (NAN(CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar9]))))))) {
            CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] =
                 tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
          }
          dVar16 = CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9];
          if ((dVar16 != 0.0) || (NAN(dVar16))) {
            dVar15 = CI_right.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar9];
            if ((dVar15 != 0.0) || (NAN(dVar15))) {
              S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar9] = (dVar15 - dVar16) * 0.5;
              dVar17 = 0.0;
            }
          }
        }
      }
    }
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x3fa999999999999a;
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x3f91eb851eb851eb;
    means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    dVar17 = 0.0;
    puVar5 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3);
        uVar7 = uVar7 + 1) {
      if ((tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar7] <= 1000.0 &&
           tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar7] != 1000.0) &&
         (1.79769313486232e+308 <=
          T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[puVar5[uVar7]])) {
        dVar16 = top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        dVar15 = bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar7];
        rVar13 = std::normal_distribution<double>::operator()
                           ((normal_distribution<double> *)&means,&generator);
        dVar17 = dVar17 + dVar16 + dVar15;
        dVar16 = 0.0;
        if (0.0 <= rVar13) {
          dVar16 = rVar13;
        }
        uVar9 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7];
        puVar5 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((dVar16 * S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar9] < dVar17) &&
           (1.79769313486232e+308 <=
            T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar9])) {
          T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar9] =
               tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
          dVar17 = 0.0;
        }
      }
    }
    dVar17 = 134.0;
    dVar16 = -14.0;
    dVar15 = 32.0;
    dVar14 = -8.0;
    dVar18 = 0.0;
    dVar21 = 0.0;
    for (uVar7 = 0;
        uVar7 < (ulong)((long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3);
        uVar7 = uVar7 + 1) {
      uVar9 = puVar5[uVar7];
      dVar20 = T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      dVar19 = tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar7];
      if (dVar20 < 1.79769313486232e+308) {
        dVar19 = dVar19 - dVar20;
        tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar7] = dVar19;
        dVar20 = T0X.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
      }
      if ((1000.0 - dVar20 <= dVar19) ||
         (win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] != 1)) {
        rVar13 = std::uniform_real_distribution<double>::operator()(&local_88,&generator);
        dVar20 = 0.0;
        dVar14 = rVar13 + 0.0;
        dVar17 = dVar14 + 134.0;
        dVar16 = dVar14 + -14.0;
        dVar15 = dVar14 + 32.0;
        dVar14 = dVar14 + -8.0;
        puVar5 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start
             [num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar7]] == 0.0) &&
           (!NAN(S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7]]))) {
          dVar22 = 0.0;
          if (((dVar21 == 0.0) && (!NAN(dVar21))) || ((dVar18 == 0.0 && (!NAN(dVar18)))))
          goto LAB_00101ff2;
          if ((dVar21 != dVar18) || (NAN(dVar21) || NAN(dVar18))) {
            S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7]] = dVar18 / dVar21;
          }
        }
        dVar22 = 0.0;
      }
      else {
        dVar20 = dVar18;
        dVar22 = dVar21;
        if ((dVar16 < dVar19) && (dVar19 < dVar17)) {
          dVar22 = dVar21 + top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7] +
                            bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7];
          if ((dVar14 < dVar19) && (dVar19 < dVar15)) {
            dVar20 = dVar18 + top.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7] +
                              bot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar7];
          }
        }
      }
LAB_00101ff2:
      dVar18 = dVar20;
      dVar21 = dVar22;
    }
    NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::operator<<((ostream *)&std::cout,
                    "evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n");
    local_298 = 0.0;
    iVar1 = 0;
    for (uVar7 = 0; uVar7 < NUMEVT; uVar7 = uVar7 + 1) {
      if ((((S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] <= local_280) ||
           (S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar7] <= 0.0)) ||
          (dVar17 = S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7], dVar17 <= 0.0)) ||
         ((1.0 <= dVar17 ||
          (dVar12 <= S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar7])))) {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      else {
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (driftT.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7] / 1000000.0);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        std::operator<<(poVar3,"\t");
        poVar3 = std::ostream::_M_insert<double>
                           (S2width.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar7]);
        std::endl<char,std::char_traits<char>>(poVar3);
        std::vector<double,_std::allocator<double>_>::push_back
                  (&NonBlank,
                   S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start + uVar7);
        local_298 = local_298 + dVar17;
        iVar1 = iVar1 + 1;
      }
    }
    if (iVar1 == 0) {
      std::operator<<((ostream *)&std::cerr,"no events in range!\n");
      iVar1 = 1;
    }
    else {
      std::
      __sort<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar15 = (double)iVar1;
      dVar17 = NonBlank.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar1 / 2];
      dVar16 = 0.0;
      for (uVar9 = 0; NUMEVT != uVar9; uVar9 = uVar9 + 1) {
        dVar14 = S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        if (((dVar14 != 0.0) || (NAN(dVar14))) &&
           ((local_280 <
             S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] &&
            (S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] < dVar12)))) {
          dVar14 = local_298 / dVar15 - dVar14;
          dVar16 = dVar16 + dVar14 * dVar14;
        }
      }
      dVar16 = dVar16 / (dVar15 + -1.0);
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      local_290 = 0.0;
      uVar7 = NUMEVT;
      for (uVar8 = 0; uVar8 < uVar7; uVar8 = uVar8 + 1) {
        dVar14 = S1f30.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        if ((((dVar14 != 0.0) || (NAN(dVar14))) &&
            (local_280 <
             S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar8])) &&
           (S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] < dVar12)) {
          dVar14 = pow((dVar14 - local_298 / dVar15) / dVar16,3.0);
          local_290 = local_290 + dVar14;
          uVar7 = NUMEVT;
        }
      }
      std::operator<<((ostream *)&std::cerr,"MEDIAN\t\tSIGMA\t\tSKEWNESS\n");
      poVar3 = std::ostream::_M_insert<double>(dVar17);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(dVar16);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_290 / dVar15);
      iVar1 = 0;
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&NonBlank.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&driftT.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&T0X.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S1f30.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S2width.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&CI_right.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&CI_left.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S2max.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S2tot.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S1tot.super__Vector_base<double,_std::allocator<double>_>);
  }
  else {
    S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&means,NUMEVT,(value_type *)&S1tot,(allocator_type *)&S2tot);
    S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S1tot,NUMEVT,(value_type *)&S2tot,(allocator_type *)&S2max);
    S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S2tot,NUMEVT,(value_type *)&S2max,(allocator_type *)&CI_left);
    CI_left.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector
              (&S2max,NUMEVT,(value_type *)&CI_left,(allocator_type *)&CI_right);
    lVar6 = (long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    for (lVar10 = 0; uVar9 = NUMEVT, lVar6 != lVar10; lVar10 = lVar10 + 1) {
      if (tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] <= 10000.0 &&
          tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar10] != 10000.0) {
        uVar9 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start[lVar10];
        S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] + 1.0;
        means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[lVar10] +
             means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9];
      }
    }
    for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
      means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar11] =
           means.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar11] /
           S1tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar11];
    }
    for (lVar10 = 0; lVar6 != lVar10; lVar10 = lVar10 + 1) {
      uVar9 = num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar10];
      dVar12 = tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar10] -
               means.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9];
      tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar10] = dVar12;
      if (ABS(dVar12) <= 200.0) {
        S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] + 1.0;
        dVar12 = tns.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar10];
      }
      if ((-69.7 <= dVar12) && (dVar12 <= 196.2)) {
        S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar9] =
             S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar9] + 1.0;
      }
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"evt#\tpromptFrac");
    std::endl<char,std::char_traits<char>>(poVar3);
    for (uVar7 = 0; uVar7 < NUMEVT; uVar7 = uVar7 + 1) {
      local_298 = 0.0;
      if (0.0 < S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7]) {
        local_298 = S2max.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7] /
                    S2tot.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar7];
      }
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::operator<<(poVar3,"\t");
      poVar3 = std::ostream::_M_insert<double>(local_298);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S2max.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S2tot.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&S1tot.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&means.super__Vector_base<double,_std::allocator<double>_>);
    iVar1 = 0;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&top.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&bot.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&tns.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&win.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&num.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return iVar1;
}

Assistant:

int main ( int argc, char** argv ) {
  
  double S1LimPE[2] = { minS1, maxS1 };
  
  if ( verbosity < 2 ) {
    if ( argc < 3 ) {
      cerr << "2 args needed: S1 (non-c) in phe (NOT phd). 1st value is min, 2nd "
	      "max."
	   << endl;
      return EXIT_FAILURE;
    }
    else {
      S1LimPE[0] = atof(argv[1]); S1LimPE[1] = atof(argv[2]);  // avoid Seg Fault!
    }
  }
  
  double MaxPossibleTime = DBL_MAX; default_random_engine generator;
  uniform_real_distribution<double> distribution(
      0., 20.);  // ns for ran offset. 2 bin default. For Case: -7,0
  // for LUX Run03: better results with -4 to 16. Still 2 samples-wide, but
  // different centering
  vector<uint64_t> num, win;
  char line[60];
  vector<double> tns, bot, top;
  FILE* ifp = fopen("photon_times.txt", "r");
  double a, b, c, d, e;
  uint64_t i = 0;

  while (1) {
    if (i == 0) {
      while (getc(ifp) != '\n') {
        ;
      }
      i = 1;
      continue;
    }
    if (fgets(line, 40, ifp) == NULL) {
      NUMEVT = unsigned(a) + 1;
      if ( NUMEVT % 10 )
        cerr << "Warning! Check to see if last event(s) missing b/c S1=0.\n";
      break;
    } else ;
    if ( verbosity < 2 )
      sscanf(line, "%lf\t%lf\t%lf\t%lf\t%lf", &a, &b, &c, &d, &e);
    else
      sscanf(line, "%lf\t%lf", &a, &b);
    if (feof(ifp)) break;
    num.push_back(uint64_t(a));
    tns.push_back(b);
    if ( verbosity < 2 ) {
      if (b > S2BORD) e = 0;
      bot.push_back(c);
      top.push_back(d);
      win.push_back(uint64_t(e));
    }
    // cerr << a << " " << b << " " << c << " " << d << " " << e << endl;
  }
  fclose(ifp);
  
  if ( verbosity >= 2 ) { //for pseudo-S1-only spike mode
    double range[4] = {-200., 200., -69.7, 196.2};
    vector<double> means(NUMEVT, 0.);
    vector<double> count(NUMEVT, 0.);
    vector<double> S1total(NUMEVT, 0.);
    vector<double> S1inner(NUMEVT, 0.);
    for ( i = 0; i < num.size(); ++i ) {
      if ( tns[i] < 1e4 ) {
	++count[num[i]];
	means[num[i]] += tns[i];
      }
    }
    for ( i = 0; i < NUMEVT; ++i ) means[i] /= count[i];
    for ( i = 0; i < num.size(); ++i ) {
      tns[i] -= means[num[i]]; //correction on means
      if ( tns[i] >= range[0] && tns[i] <= range[1] )
	++S1total[num[i]];
      if ( tns[i] >= range[2] && tns[i] <= range[3] )
	++S1inner[num[i]];
    }
    cout << "evt#\tpromptFrac" << endl;
    for ( i = 0; i < NUMEVT; ++i ) {
      double promptFrac = 0.0;
      if ( S1total[i] > 0. )
	promptFrac = S1inner[i] / S1total[i];
      cout << i << "\t" << promptFrac << endl;
    }
    return EXIT_SUCCESS;
  }
  
  vector<double> S1tot(NUMEVT, 0.);
  vector<double> S2tot(NUMEVT, 0.);
  vector<double> S2max(NUMEVT, 0.);
  vector<double> CI_left(NUMEVT, 0.);
  vector<double> CI_right(NUMEVT, 0.);
  vector<double> S2width(NUMEVT, 0.);
  vector<double> S1f30(NUMEVT, 0.);
  vector<double> T0X(NUMEVT, 0.);
  vector<double> driftT(NUMEVT, 0.);

  for (i = 0; i < num.size(); ++i) {
    T0X[num[i]] = MaxPossibleTime;
    if (tns[i] < S2BORD)
      S1tot[num[i]] += top[i] + bot[i];
    else {
      S2tot[num[i]] += (top[i] + bot[i]) * LOSTAREA;
      if ((top[i] + bot[i]) > S2max[num[i]]) {
        S2max[num[i]] = top[i] + bot[i];
        driftT[num[i]] =
            tns[i] -
            S2BORD;  // minus 1 microsecond fudge factor to get mean drift
      } else
        ;
    }
  }
  double fraction = 0.0225,
         soFar = 0.;  // default Confidence Interval is 95.5% (~2-sigma)
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] >= S2BORD && S2width[num[i]] == 0.) {
      soFar += (top[i] + bot[i]) * LOSTAREA;
      if (soFar > fraction * S2tot[num[i]] && CI_left[num[i]] == 0. &&
          CI_right[num[i]] == 0.)
        CI_left[num[i]] = tns[i];
      if (soFar > 0.500000 * S2tot[num[i]] && CI_right[num[i]] == 0. &&
          CI_left[num[i]] != 0.)
        CI_right[num[i]] = tns[i];  // left half only because of asymmetry
      if (CI_left[num[i]] != 0. && CI_right[num[i]] != 0.) {
        S2width[num[i]] = (CI_right[num[i]] - CI_left[num[i]]) / 2.;
        soFar = 0.0;
        continue;
      }  // div by 2 as 1s--1s=2sigma
    }
  }
  soFar = 0.00;
  normal_distribution<double> distribution2(RISEDEF, RISEDEF * UNC);
  for (i = 0; i < num.size(); ++i) {
    if (tns[i] < S2BORD && T0X[num[i]] >= MaxPossibleTime) {
      soFar += top[i] + bot[i];
      fraction = distribution2(generator);
      if (fraction < 0.) fraction = 0.;
      if (soFar > (fraction * S1tot[num[i]]) &&
          T0X[num[i]] >= MaxPossibleTime) {
        T0X[num[i]] = tns[i]; //time of "actual" S1 peak start
        soFar = 0.0;
        continue;
      }
    }
  }

  double area[2] = {0.0, 0.0};
  double range[4] = {-14., 134., -8., 32.};
  double rRange[4] = {range[0], range[1], range[2],
                      range[3]};  // Dahl: -50,300,-50,10
  for (i = 0; i < num.size(); ++i) {
    if (T0X[num[i]] < MaxPossibleTime) tns[i] -= T0X[num[i]];
    if (tns[i] < (S2BORD - T0X[num[i]]) && win[i] == 1) {
      if (tns[i] > rRange[0] && tns[i] < rRange[1]) {
        area[0] += top[i] + bot[i];
        if (tns[i] > rRange[2] && tns[i] < rRange[3])
          area[1] += top[i] + bot[i];
      }
    } else {
      double offset0 =
          0.0 +
          distribution(generator);  // consider unique offset for each
                                    // range[]. In original try makes bumps
      // double offset1 = 10.+distribution(generator);
      // double offset2 = 10.+distribution(generator);
      // double offset3 = 10.+distribution(generator);
      // randomized offset was to create extra smearing to better match real data with unknowns in the DAQ
      rRange[0] = range[0] + offset0;
      rRange[1] = range[1] + offset0;
      rRange[2] = range[2] + offset0;
      rRange[3] = range[3] + offset0;
      if (S1f30[num[i]] == 0. && area[0] != 0. && area[1] != 0. &&
          area[0] != area[1])
        S1f30[num[i]] = area[1] / area[0];
      area[0] = 0.0;
      area[1] = 0.0;
    }
  }

  double mean = 0.0;
  int j = 0;
  vector<double> NonBlank;
  cout << "evt#\tS1, pe\tpromptFrac\tdrift [ms]\tS2, pe\tWidth [ns]\n";
  for (i = 0; i < NUMEVT; ++i) {
    // cerr << T0X[i] << endl;
    if (S1tot[i] > S1LimPE[0] && S2tot[i] > 0. && S1f30[i] > 0. &&
        S1f30[i] < 1. && S1tot[i] < S1LimPE[1]) {
      mean += S1f30[i];
      ++j;
      cout << i << "\t" << S1tot[i] << "\t" << S1f30[i] << "\t"
           << driftT[i] / 1e6 << "\t" << S2tot[i] << "\t" << S2width[i] << endl;
      NonBlank.push_back(S1f30[i]);
    } else
      cout << i << endl;
  }
  if (j == 0) {
    cerr << "no events in range!\n";
    return EXIT_FAILURE;
  }
  mean /= double(j);
  std::sort(NonBlank.begin(), NonBlank.end());
  double median = NonBlank[j / 2];

  double sigma = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      sigma += (mean - S1f30[i]) * (mean - S1f30[i]);
  sigma /= (double(j) - 1.);
  sigma = sqrt(sigma);
  double skew = 0.0;
  for (i = 0; i < NUMEVT; ++i)
    if (S1f30[i] != 0. && S1tot[i] > S1LimPE[0] && S1tot[i] < S1LimPE[1])
      skew += pow((S1f30[i] - mean) / sigma, 3.);
  skew /= double(j);
  cerr << "MEDIAN\t\tSIGMA\t\tSKEWNESS\n";
  cerr << median << "\t" << sigma << "\t" << skew
       << endl;  // can switch to "mean," as desired, but change the header name
                 // too :)
  
  return EXIT_SUCCESS;
  
}